

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile(MultiPartOutputFile *this)

{
  ~MultiPartOutputFile(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

MultiPartOutputFile::~MultiPartOutputFile ()
{
    for (map<int, GenericOutputFile*>::iterator it = _data->_outputFiles.begin();
         it != _data->_outputFiles.end(); it++)
    {
        delete it->second;
    }

    delete _data;
}